

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O0

int __thiscall
JsUtil::
BaseDictionary<char16_t_const*,DynamicProfileStorage::StorageInfo,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>
::FindEntryWithKey<char16_t_const*>
          (BaseDictionary<char16_t_const*,DynamicProfileStorage::StorageInfo,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>
           *this,char16_t **key)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  hash_t hashCode_00;
  uint uVar4;
  int local_44;
  int i;
  EntryType *localEntries;
  uint targetBucket;
  hash_t hashCode;
  int *localBuckets;
  uint depth;
  char16_t **key_local;
  BaseDictionary<const_char16_t_*,_DynamicProfileStorage::StorageInfo,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
  *this_local;
  
  localBuckets._4_4_ = 0;
  lVar1 = *(long *)this;
  if (lVar1 != 0) {
    hashCode_00 = GetHashCodeWithKey<char16_t_const*>(key);
    uVar4 = BaseDictionary<const_char16_t_*,_DynamicProfileStorage::StorageInfo,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
            ::GetBucket((BaseDictionary<const_char16_t_*,_DynamicProfileStorage::StorageInfo,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
                         *)this,hashCode_00);
    lVar2 = *(long *)(this + 8);
    for (local_44 = *(int *)(lVar1 + (ulong)uVar4 * 4); -1 < local_44;
        local_44 = *(int *)(lVar2 + (long)local_44 * 0x28 + 0x10)) {
      bVar3 = CacheHashedEntry<char16_t_const*,DynamicProfileStorage::StorageInfo,JsUtil::(anonymous_namespace)::KeyValueEntry>
              ::KeyEquals<DefaultComparer<char16_t_const*>,char16_t_const*>
                        ((CacheHashedEntry<char16_t_const*,DynamicProfileStorage::StorageInfo,JsUtil::(anonymous_namespace)::KeyValueEntry>
                          *)(lVar2 + (long)local_44 * 0x28),key,hashCode_00);
      if (bVar3) {
        if (*(long *)(this + 0x30) != 0) {
          DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),localBuckets._4_4_);
        }
        return local_44;
      }
      localBuckets._4_4_ = localBuckets._4_4_ + 1;
    }
  }
  if (*(long *)(this + 0x30) != 0) {
    DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),localBuckets._4_4_);
  }
  return -1;
}

Assistant:

inline int FindEntryWithKey(const LookupType& key) const
        {
#if PROFILE_DICTIONARY
            uint depth = 0;
#endif
            int * localBuckets = buckets;
            if (localBuckets != nullptr)
            {
                hash_t hashCode = GetHashCodeWithKey<LookupType>(key);
                uint targetBucket = this->GetBucket(hashCode);
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        return i;
                    }

#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }
            }

#if PROFILE_DICTIONARY
            if (stats)
                stats->Lookup(depth);
#endif
            return -1;
        }